

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_rfc6979_hmac_sha256(void *arg,int iters)

{
  int in_ESI;
  secp256k1_rfc6979_hmac_sha256 rng;
  bench_inv *data;
  int i;
  uchar *in_stack_00000068;
  secp256k1_rfc6979_hmac_sha256 *in_stack_00000070;
  size_t in_stack_00000140;
  uchar *in_stack_00000148;
  secp256k1_rfc6979_hmac_sha256 *in_stack_00000150;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    secp256k1_rfc6979_hmac_sha256_initialize(in_stack_00000070,in_stack_00000068,(size_t)arg);
    secp256k1_rfc6979_hmac_sha256_generate(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  }
  return;
}

Assistant:

static void bench_rfc6979_hmac_sha256(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_rfc6979_hmac_sha256 rng;

    for (i = 0; i < iters; i++) {
        secp256k1_rfc6979_hmac_sha256_initialize(&rng, data->data, 64);
        secp256k1_rfc6979_hmac_sha256_generate(&rng, data->data, 32);
    }
}